

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

mpc_parser_t * mpc_re_mode(char *re,int mode)

{
  int iVar1;
  mpc_parser_t *pmVar2;
  mpc_parser_t *pmVar3;
  mpc_parser_t *pmVar4;
  mpc_parser_t *pmVar5;
  void *pvVar6;
  void *pvVar7;
  mpc_parser_t *a;
  mpc_input_t *i;
  char *__ptr;
  mpc_result_t mVar8;
  mpc_result_t r;
  mpc_result_t local_80;
  mpc_parser_t *local_78;
  int local_6c;
  mpc_parser_t *local_68;
  mpc_parser_t *local_60;
  mpc_parser_t *local_58;
  mpc_parser_t *local_50;
  mpc_parser_t *local_48;
  mpc_parser_t *local_40;
  char *local_38;
  
  local_6c = mode;
  local_38 = re;
  pmVar2 = mpc_new("regex");
  local_68 = pmVar2;
  pmVar3 = mpc_new("term");
  pmVar4 = mpc_new("factor");
  local_78 = pmVar4;
  local_60 = mpc_new("base");
  local_58 = mpc_new("range");
  pmVar5 = (mpc_parser_t *)calloc(1,0x38);
  pmVar5->type = '\t';
  (pmVar5->data).range.x = '|';
  pmVar5 = mpc_expectf(pmVar5,"\'%c\'",0x7c);
  pmVar5 = mpc_and(2,mpcf_snd_free,pmVar5,pmVar2,free);
  pvVar6 = calloc(1,0x38);
  *(undefined1 *)((long)pvVar6 + 0x30) = 0x13;
  *(mpc_parser_t **)((long)pvVar6 + 8) = pmVar5;
  *(code **)((long)pvVar6 + 0x18) = mpcf_ctor_null;
  local_50 = pmVar3;
  pmVar5 = mpc_and(2,mpcf_re_or,pmVar3,pvVar6,mpc_delete);
  mpc_define(pmVar2,pmVar5);
  pmVar2 = (mpc_parser_t *)calloc(1,0x38);
  pmVar2->type = '\x14';
  (pmVar2->data).repeat.x = pmVar4;
  (pmVar2->data).apply.f = mpcf_re_and;
  mpc_define(pmVar3,pmVar2);
  pmVar2 = (mpc_parser_t *)calloc(1,0x38);
  pmVar2->type = '\t';
  (pmVar2->data).range.x = '*';
  pmVar2 = mpc_expectf(pmVar2,"\'%c\'",0x2a);
  pmVar3 = (mpc_parser_t *)calloc(1,0x38);
  pmVar3->type = '\t';
  (pmVar3->data).range.x = '+';
  pmVar3 = mpc_expectf(pmVar3,"\'%c\'",0x2b);
  pmVar4 = (mpc_parser_t *)calloc(1,0x38);
  pmVar4->type = '\t';
  (pmVar4->data).range.x = '?';
  pmVar4 = mpc_expectf(pmVar4,"\'%c\'",0x3f);
  pmVar5 = mpc_int();
  pmVar5 = mpc_between(pmVar5,free,"{","}");
  pvVar6 = calloc(1,0x38);
  *(undefined1 *)((long)pvVar6 + 0x30) = 1;
  pmVar2 = mpc_or(5,pmVar2,pmVar3,pmVar4,pmVar5,pvVar6);
  pmVar2 = mpc_and(2,mpcf_re_repeat,local_60,pmVar2,mpc_delete);
  mpc_define(local_78,pmVar2);
  pmVar2 = local_68;
  local_40 = mpc_between(local_68,mpc_delete,"(",")");
  local_48 = mpc_between(local_58,mpc_delete,"[","]");
  pmVar3 = mpc_escape();
  pvVar6 = calloc(1,0x38);
  *(undefined1 *)((long)pvVar6 + 0x30) = 0x10;
  *(mpc_parser_t **)((long)pvVar6 + 8) = pmVar3;
  *(code **)((long)pvVar6 + 0x10) = mpcf_re_escape;
  *(int **)((long)pvVar6 + 0x18) = &local_6c;
  pmVar3 = mpc_noneof(")|");
  pvVar7 = calloc(1,0x38);
  *(undefined1 *)((long)pvVar7 + 0x30) = 0x10;
  *(mpc_parser_t **)((long)pvVar7 + 8) = pmVar3;
  *(code **)((long)pvVar7 + 0x10) = mpcf_re_escape;
  *(int **)((long)pvVar7 + 0x18) = &local_6c;
  pmVar4 = mpc_or(4,local_40,local_48,pvVar6,pvVar7);
  pmVar3 = local_60;
  mpc_define(local_60,pmVar4);
  pmVar4 = mpc_escape();
  pmVar5 = mpc_noneof("]");
  pmVar4 = mpc_or(2,pmVar4,pmVar5);
  pmVar5 = (mpc_parser_t *)calloc(1,0x38);
  pmVar5->type = '\x14';
  (pmVar5->data).repeat.x = pmVar4;
  (pmVar5->data).apply.f = mpcf_strfold;
  a = (mpc_parser_t *)calloc(1,0x38);
  pmVar4 = local_58;
  a->type = '\x0f';
  (a->data).expect.x = pmVar5;
  (a->data).apply.f = mpcf_re_range;
  mpc_define(local_58,a);
  pmVar5 = (mpc_parser_t *)calloc(1,0x38);
  pmVar5->type = '\x11';
  (pmVar5->data).expect.x = pmVar2;
  pmVar5 = mpc_whole(pmVar5,mpc_delete);
  mpc_optimise_unretained(pmVar5,1);
  mpc_optimise_unretained(pmVar2,1);
  mpc_optimise_unretained(local_50,1);
  mpc_optimise_unretained(local_78,1);
  mpc_optimise_unretained(pmVar3,1);
  mpc_optimise_unretained(pmVar4,1);
  i = mpc_input_new_string("<mpc_re_compiler>",local_38);
  iVar1 = mpc_parse_input(i,pmVar5,&local_80);
  mpc_input_delete(i);
  if (iVar1 == 0) {
    __ptr = mpc_err_string(local_80.error);
    mVar8.error = (mpc_err_t *)mpc_failf("Invalid Regex: %s",__ptr);
    mpc_err_delete(local_80.error);
    free(__ptr);
    local_80.error = mVar8.error;
  }
  mpc_cleanup(6,pmVar5,local_68,local_50,local_78,pmVar3,pmVar4);
  mpc_optimise_unretained((mpc_parser_t *)local_80.error,1);
  return (mpc_parser_t *)local_80.error;
}

Assistant:

mpc_parser_t *mpc_re_mode(const char *re, int mode) {

  char *err_msg;
  mpc_parser_t *err_out;
  mpc_result_t r;
  mpc_parser_t *Regex, *Term, *Factor, *Base, *Range, *RegexEnclose;

  Regex  = mpc_new("regex");
  Term   = mpc_new("term");
  Factor = mpc_new("factor");
  Base   = mpc_new("base");
  Range  = mpc_new("range");

  mpc_define(Regex, mpc_and(2, mpcf_re_or,
    Term,
    mpc_maybe(mpc_and(2, mpcf_snd_free, mpc_char('|'), Regex, free)),
    (mpc_dtor_t)mpc_delete
  ));

  mpc_define(Term, mpc_many(mpcf_re_and, Factor));

  mpc_define(Factor, mpc_and(2, mpcf_re_repeat,
    Base,
    mpc_or(5,
      mpc_char('*'), mpc_char('+'), mpc_char('?'),
      mpc_brackets(mpc_int(), free),
      mpc_pass()),
    (mpc_dtor_t)mpc_delete
  ));

  mpc_define(Base, mpc_or(4,
    mpc_parens(Regex, (mpc_dtor_t)mpc_delete),
    mpc_squares(Range, (mpc_dtor_t)mpc_delete),
    mpc_apply_to(mpc_escape(), mpcf_re_escape, &mode),
    mpc_apply_to(mpc_noneof(")|"), mpcf_re_escape, &mode)
  ));

  mpc_define(Range, mpc_apply(
    mpc_many(mpcf_strfold, mpc_or(2, mpc_escape(), mpc_noneof("]"))),
    mpcf_re_range
  ));

  RegexEnclose = mpc_whole(mpc_predictive(Regex), (mpc_dtor_t)mpc_delete);

  mpc_optimise(RegexEnclose);
  mpc_optimise(Regex);
  mpc_optimise(Term);
  mpc_optimise(Factor);
  mpc_optimise(Base);
  mpc_optimise(Range);

  if(!mpc_parse("<mpc_re_compiler>", re, RegexEnclose, &r)) {
    err_msg = mpc_err_string(r.error);
    err_out = mpc_failf("Invalid Regex: %s", err_msg);
    mpc_err_delete(r.error);
    free(err_msg);
    r.output = err_out;
  }

  mpc_cleanup(6, RegexEnclose, Regex, Term, Factor, Base, Range);

  mpc_optimise(r.output);

  return r.output;

}